

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_unmark_relax(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL again;
  REF_CELL ref_cell;
  REF_INT nmark;
  REF_INT nsweeps;
  REF_INT cell;
  REF_INT group;
  REF_SUBDIV ref_subdiv_local;
  
  _cell = ref_subdiv;
  uVar1 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (uVar1 == 0) {
    ref_cell._4_4_ = 0;
    ref_private_macro_code_rss_1 = 1;
    do {
      if (ref_private_macro_code_rss_1 == 0) {
        if (_cell->instrument != 0) {
          uVar1 = ref_subdiv_mark_n(_cell,(REF_INT *)&ref_cell);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,599,"ref_subdiv_unmark_relax",(ulong)uVar1,"count");
            return uVar1;
          }
          if (_cell->grid->mpi->id == 0) {
            printf(" %d edges marked after %d unmark relaxations\n",(ulong)(uint)ref_cell,
                   (ulong)ref_cell._4_4_);
          }
        }
        return 0;
      }
      ref_cell._4_4_ = ref_cell._4_4_ + 1;
      ref_private_macro_code_rss_1 = 0;
      nsweeps = 8;
      _ref_private_macro_code_rss = _cell->grid->cell[8];
      while (nsweeps < 0x10) {
        for (nmark = 0; nmark < _ref_private_macro_code_rss->max; nmark = nmark + 1) {
          if ((((-1 < nmark) && (nmark < _ref_private_macro_code_rss->max)) &&
              (_ref_private_macro_code_rss->c2n[_ref_private_macro_code_rss->size_per * nmark] != -1
              )) && ((_ref_private_macro_code_rss->node_per == 4 &&
                     (uVar1 = ref_subdiv_unmark_tet(_cell,nmark,&ref_private_macro_code_rss_1),
                     uVar1 != 0)))) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x23b,"ref_subdiv_unmark_relax",(ulong)uVar1,"unmark tet");
            return uVar1;
          }
        }
        nsweeps = nsweeps + 1;
        _ref_private_macro_code_rss = _cell->grid->cell[nsweeps];
      }
      uVar1 = ref_edge_ghost_min_int(_cell->edge,_cell->grid->mpi,_cell->mark);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x248,"ref_subdiv_unmark_relax",(ulong)uVar1,"ghost mark");
        return uVar1;
      }
      if (5 < (int)ref_cell._4_4_) {
        uVar1 = ref_subdiv_mark_n(_cell,(REF_INT *)&ref_cell);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x24b,"ref_subdiv_unmark_relax",(ulong)uVar1,"count");
          return uVar1;
        }
        if (_cell->grid->mpi->id == 0) {
          printf(" %d edges marked after %d unmark relaxations\n",(ulong)(uint)ref_cell,
                 (ulong)ref_cell._4_4_);
        }
      }
      if (ref_cell._4_4_ == 200) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x251,"ref_subdiv_unmark_relax","too many sweeps, stop inf loop");
        return 1;
      }
      ref_subdiv_local._4_4_ = ref_mpi_all_or(_cell->grid->mpi,&ref_private_macro_code_rss_1);
    } while (ref_subdiv_local._4_4_ == 0);
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x253,
           "ref_subdiv_unmark_relax",(ulong)ref_subdiv_local._4_4_,"mpi all or");
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x22e,
           "ref_subdiv_unmark_relax",(ulong)uVar1,"ghost mark");
    ref_subdiv_local._4_4_ = uVar1;
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_unmark_relax(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, nsweeps, nmark;
  REF_CELL ref_cell;
  REF_BOOL again;

  /* make sure consistent before starting */
  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;

    each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:

            RSS(ref_subdiv_unmark_tet(ref_subdiv, cell, &again), "unmark tet");

            break;
          default:
            /* RSS(REF_IMPLEMENT,"implement cell type"); */
            break;
        }
      }
    }

    /* most conservative, unmark if any ghosts unmarked */
    RSS(ref_edge_ghost_min_int(ref_subdiv_edge(ref_subdiv),
                               ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
        "ghost mark");

    if (nsweeps > 5) {
      RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
      if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
        printf(" %d edges marked after %d unmark relaxations\n", nmark,
               nsweeps);
    }

    RUS(200, nsweeps, "too many sweeps, stop inf loop");

    RSS(ref_mpi_all_or(ref_subdiv_mpi(ref_subdiv), &again), "mpi all or");
  }

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked after %d unmark relaxations\n", nmark, nsweeps);
  }

  return REF_SUCCESS;
}